

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

Ivy_Obj_t * Ivy_ObjRecognizeMux(Ivy_Obj_t *pNode,Ivy_Obj_t **ppNodeT,Ivy_Obj_t **ppNodeE)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pNode1;
  Ivy_Obj_t *pNode0;
  Ivy_Obj_t **ppNodeE_local;
  Ivy_Obj_t **ppNodeT_local;
  Ivy_Obj_t *pNode_local;
  
  iVar1 = Ivy_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                  ,0x208,"Ivy_Obj_t *Ivy_ObjRecognizeMux(Ivy_Obj_t *, Ivy_Obj_t **, Ivy_Obj_t **)");
  }
  iVar1 = Ivy_ObjIsMuxType(pNode);
  if (iVar1 != 0) {
    pIVar3 = Ivy_ObjFanin0(pNode);
    pIVar4 = Ivy_ObjFanin1(pNode);
    iVar1 = Ivy_ObjFaninId0(pIVar3);
    iVar2 = Ivy_ObjFaninId0(pIVar4);
    if (iVar1 == iVar2) {
      iVar1 = Ivy_ObjFaninC0(pIVar3);
      iVar2 = Ivy_ObjFaninC0(pIVar4);
      if (iVar1 != iVar2) {
        iVar1 = Ivy_ObjFaninC0(pIVar3);
        if (iVar1 != 0) {
          pIVar5 = Ivy_ObjChild1(pIVar4);
          pIVar5 = Ivy_Not(pIVar5);
          *ppNodeT = pIVar5;
          pIVar3 = Ivy_ObjChild1(pIVar3);
          pIVar3 = Ivy_Not(pIVar3);
          *ppNodeE = pIVar3;
          pIVar3 = Ivy_ObjChild0(pIVar4);
          return pIVar3;
        }
        pIVar5 = Ivy_ObjChild1(pIVar3);
        pIVar5 = Ivy_Not(pIVar5);
        *ppNodeT = pIVar5;
        pIVar4 = Ivy_ObjChild1(pIVar4);
        pIVar4 = Ivy_Not(pIVar4);
        *ppNodeE = pIVar4;
        pIVar3 = Ivy_ObjChild0(pIVar3);
        return pIVar3;
      }
    }
    iVar1 = Ivy_ObjFaninId0(pIVar3);
    iVar2 = Ivy_ObjFaninId1(pIVar4);
    if (iVar1 == iVar2) {
      iVar1 = Ivy_ObjFaninC0(pIVar3);
      iVar2 = Ivy_ObjFaninC1(pIVar4);
      if (iVar1 != iVar2) {
        iVar1 = Ivy_ObjFaninC0(pIVar3);
        if (iVar1 != 0) {
          pIVar5 = Ivy_ObjChild0(pIVar4);
          pIVar5 = Ivy_Not(pIVar5);
          *ppNodeT = pIVar5;
          pIVar3 = Ivy_ObjChild1(pIVar3);
          pIVar3 = Ivy_Not(pIVar3);
          *ppNodeE = pIVar3;
          pIVar3 = Ivy_ObjChild1(pIVar4);
          return pIVar3;
        }
        pIVar5 = Ivy_ObjChild1(pIVar3);
        pIVar5 = Ivy_Not(pIVar5);
        *ppNodeT = pIVar5;
        pIVar4 = Ivy_ObjChild0(pIVar4);
        pIVar4 = Ivy_Not(pIVar4);
        *ppNodeE = pIVar4;
        pIVar3 = Ivy_ObjChild0(pIVar3);
        return pIVar3;
      }
    }
    iVar1 = Ivy_ObjFaninId1(pIVar3);
    iVar2 = Ivy_ObjFaninId0(pIVar4);
    if (iVar1 == iVar2) {
      iVar1 = Ivy_ObjFaninC1(pIVar3);
      iVar2 = Ivy_ObjFaninC0(pIVar4);
      if (iVar1 != iVar2) {
        iVar1 = Ivy_ObjFaninC1(pIVar3);
        if (iVar1 != 0) {
          pIVar5 = Ivy_ObjChild1(pIVar4);
          pIVar5 = Ivy_Not(pIVar5);
          *ppNodeT = pIVar5;
          pIVar3 = Ivy_ObjChild0(pIVar3);
          pIVar3 = Ivy_Not(pIVar3);
          *ppNodeE = pIVar3;
          pIVar3 = Ivy_ObjChild0(pIVar4);
          return pIVar3;
        }
        pIVar5 = Ivy_ObjChild0(pIVar3);
        pIVar5 = Ivy_Not(pIVar5);
        *ppNodeT = pIVar5;
        pIVar4 = Ivy_ObjChild1(pIVar4);
        pIVar4 = Ivy_Not(pIVar4);
        *ppNodeE = pIVar4;
        pIVar3 = Ivy_ObjChild1(pIVar3);
        return pIVar3;
      }
    }
    iVar1 = Ivy_ObjFaninId1(pIVar3);
    iVar2 = Ivy_ObjFaninId1(pIVar4);
    if (iVar1 == iVar2) {
      iVar1 = Ivy_ObjFaninC1(pIVar3);
      iVar2 = Ivy_ObjFaninC1(pIVar4);
      if (iVar1 != iVar2) {
        iVar1 = Ivy_ObjFaninC1(pIVar3);
        if (iVar1 == 0) {
          pIVar5 = Ivy_ObjChild0(pIVar3);
          pIVar5 = Ivy_Not(pIVar5);
          *ppNodeT = pIVar5;
          pIVar4 = Ivy_ObjChild0(pIVar4);
          pIVar4 = Ivy_Not(pIVar4);
          *ppNodeE = pIVar4;
          pNode_local = Ivy_ObjChild1(pIVar3);
        }
        else {
          pIVar5 = Ivy_ObjChild0(pIVar4);
          pIVar5 = Ivy_Not(pIVar5);
          *ppNodeT = pIVar5;
          pIVar3 = Ivy_ObjChild0(pIVar3);
          pIVar3 = Ivy_Not(pIVar3);
          *ppNodeE = pIVar3;
          pNode_local = Ivy_ObjChild1(pIVar4);
        }
        return pNode_local;
      }
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                  ,0x252,"Ivy_Obj_t *Ivy_ObjRecognizeMux(Ivy_Obj_t *, Ivy_Obj_t **, Ivy_Obj_t **)");
  }
  __assert_fail("Ivy_ObjIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                ,0x209,"Ivy_Obj_t *Ivy_ObjRecognizeMux(Ivy_Obj_t *, Ivy_Obj_t **, Ivy_Obj_t **)");
}

Assistant:

Ivy_Obj_t * Ivy_ObjRecognizeMux( Ivy_Obj_t * pNode, Ivy_Obj_t ** ppNodeT, Ivy_Obj_t ** ppNodeE )
{
    Ivy_Obj_t * pNode0, * pNode1;
    assert( !Ivy_IsComplement(pNode) );
    assert( Ivy_ObjIsMuxType(pNode) );
    // get children
    pNode0 = Ivy_ObjFanin0(pNode);
    pNode1 = Ivy_ObjFanin1(pNode);
    // find the control variable
//    if ( pNode1->p1 == Fraig_Not(pNode2->p1) )
    if ( Ivy_ObjFaninId0(pNode0) == Ivy_ObjFaninId0(pNode1) && (Ivy_ObjFaninC0(pNode0) ^ Ivy_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Ivy_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Ivy_Not(Ivy_ObjChild1(pNode0));//pNode1->p2);
            return Ivy_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Ivy_Not(Ivy_ObjChild1(pNode1));//pNode2->p2);
            return Ivy_ObjChild0(pNode0);//pNode1->p1;
        }
    }
//    else if ( pNode1->p1 == Fraig_Not(pNode2->p2) )
    else if ( Ivy_ObjFaninId0(pNode0) == Ivy_ObjFaninId1(pNode1) && (Ivy_ObjFaninC0(pNode0) ^ Ivy_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Ivy_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Ivy_Not(Ivy_ObjChild1(pNode0));//pNode1->p2);
            return Ivy_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Ivy_Not(Ivy_ObjChild0(pNode1));//pNode2->p1);
            return Ivy_ObjChild0(pNode0);//pNode1->p1;
        }
    }
//    else if ( pNode1->p2 == Fraig_Not(pNode2->p1) )
    else if ( Ivy_ObjFaninId1(pNode0) == Ivy_ObjFaninId0(pNode1) && (Ivy_ObjFaninC1(pNode0) ^ Ivy_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Ivy_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Ivy_Not(Ivy_ObjChild0(pNode0));//pNode1->p1);
            return Ivy_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Ivy_Not(Ivy_ObjChild1(pNode1));//pNode2->p2);
            return Ivy_ObjChild1(pNode0);//pNode1->p2;
        }
    }
//    else if ( pNode1->p2 == Fraig_Not(pNode2->p2) )
    else if ( Ivy_ObjFaninId1(pNode0) == Ivy_ObjFaninId1(pNode1) && (Ivy_ObjFaninC1(pNode0) ^ Ivy_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Ivy_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Ivy_Not(Ivy_ObjChild0(pNode0));//pNode1->p1);
            return Ivy_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Ivy_Not(Ivy_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Ivy_Not(Ivy_ObjChild0(pNode1));//pNode2->p1);
            return Ivy_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}